

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringRadius.hpp
# Opt level: O1

optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> * __thiscall
njoy::ENDFtk::section::Type<2,151>::Isotope::
readScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *__return_storage_ptr__,
          Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int NRO)

{
  undefined8 *puVar1;
  undefined8 local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  pointer plStack_80;
  pointer local_78;
  undefined8 local_70;
  pointer plStack_68;
  pointer local_60;
  undefined8 local_58;
  pointer pdStack_50;
  pointer local_48;
  undefined8 local_40;
  pointer pdStack_38;
  pointer local_30;
  
  if (MT == 1) {
    ScatteringRadius::ScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ScatteringRadius *)&local_b8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
      _M_payload._M_value.super_TabulationRecord.super_InterpolationBase = local_b8;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
            )._M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 8))->_M_head_impl =
         lStack_b0;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
            )._M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x10))->
    _M_head_impl = local_a8;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
            )._M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x18))->
    _M_head_impl = lStack_a0;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
            )._M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x20))->
    _M_head_impl = local_98;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
            )._M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x28))->
    _M_head_impl = dStack_90;
    *(undefined8 *)
     &(((vector<long,_std::allocator<long>_> *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
               )._M_payload.
               super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
               .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
               _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x30))->
      super__Vector_base<long,_std::allocator<long>_>)._M_impl = local_88;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x38) = plStack_80
    ;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x40) = local_78;
    *(undefined8 *)
     &(((vector<long,_std::allocator<long>_> *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
               )._M_payload.
               super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
               .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
               _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x48))->
      super__Vector_base<long,_std::allocator<long>_>)._M_impl = local_70;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x50) = plStack_68
    ;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x58) = local_60;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
      _M_payload._M_value.super_TabulationRecord.xValues.
      super__Vector_base<double,_std::allocator<double>_>._M_impl = local_58;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.xValues + 8) = pdStack_50;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.xValues + 0x10) = local_48;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
      _M_payload._M_value.super_TabulationRecord.yValues.
      super__Vector_base<double,_std::allocator<double>_>._M_impl = local_40;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.yValues + 8) = pdStack_38;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
             _M_payload._M_value.super_TabulationRecord.yValues + 0x10) = local_30;
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
    .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>._M_engaged
         = true;
  }
  else {
    if (MT != 0) {
      tools::Log::error<char_const*>("Encountered illegal NRO value");
      tools::Log::info<char_const*>
                (
                "NRO is either 0 (no energy dependent scattering radius given) or 1 (an energy dependent scattering radius is given)"
                );
      tools::Log::info<char_const*,int>("NRO value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
    .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>._M_engaged
         = false;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional< ScatteringRadius >
readScatteringRadius( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT,
                      int NRO ) {

  switch ( NRO ) {

    // no energy dependent scattering radius
    case 0 : return std::nullopt;
    // energy dependent scattering radius
    case 1 : return ScatteringRadius( begin, end, lineNumber, MAT, MF, MT );
    default : {

      Log::error( "Encountered illegal NRO value" );
      Log::info( "NRO is either 0 (no energy dependent scattering radius "
                 "given) or 1 (an energy dependent scattering radius is "
                 "given)" );
      Log::info( "NRO value: {}", NRO );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}